

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

int oonf_layer2_neigh_set_nexthop(oonf_layer2_neigh *neigh,netaddr *nexthop)

{
  uint8_t uVar1;
  int iVar2;
  netaddr *local_38;
  netaddr *nh;
  oonf_layer2_neigh_mods mod;
  netaddr *nexthop_local;
  oonf_layer2_neigh *neigh_local;
  
  if (nexthop->_type == '\x02') {
    local_38 = &neigh->_next_hop_v4;
    nh._4_4_ = OONF_LAYER2_NEIGH_MODIFY_NEXTHOP_V4;
  }
  else {
    if (nexthop->_type != '\n') {
      return -1;
    }
    local_38 = &neigh->_next_hop_v6;
    nh._4_4_ = OONF_LAYER2_NEIGH_MODIFY_NEXTHOP_V6;
  }
  iVar2 = memcmp(local_38,nexthop,0x12);
  if (iVar2 == 0) {
    neigh_local._4_4_ = -1;
  }
  else {
    *(undefined8 *)local_38->_addr = *(undefined8 *)nexthop->_addr;
    *(undefined8 *)(local_38->_addr + 8) = *(undefined8 *)(nexthop->_addr + 8);
    uVar1 = nexthop->_prefix_len;
    local_38->_type = nexthop->_type;
    local_38->_prefix_len = uVar1;
    neigh->modified = nh._4_4_ | neigh->modified;
    neigh_local._4_4_ = 0;
  }
  return neigh_local._4_4_;
}

Assistant:

int
oonf_layer2_neigh_set_nexthop(struct oonf_layer2_neigh *neigh, const struct netaddr *nexthop) {
  enum oonf_layer2_neigh_mods mod;
  struct netaddr *nh;

  switch (netaddr_get_address_family(nexthop)) {
    case AF_INET:
      nh = &neigh->_next_hop_v4;
      mod = OONF_LAYER2_NEIGH_MODIFY_NEXTHOP_V4;
      break;
    case AF_INET6:
      nh = &neigh->_next_hop_v6;
      mod = OONF_LAYER2_NEIGH_MODIFY_NEXTHOP_V6;
      break;
    default:
      return -1;
  }

  if (memcmp(nh, nexthop, sizeof(*nexthop)) == 0) {
    return -1;
  }

  memcpy(nh, nexthop, sizeof(*nexthop));
  neigh->modified |= mod;
  return 0;
}